

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QSet<QPersistentModelIndex> * __thiscall
QSet<QPersistentModelIndex>::subtract
          (QSet<QPersistentModelIndex> *this,QSet<QPersistentModelIndex> *other)

{
  long lVar1;
  bool bVar2;
  QPersistentModelIndex *__filename;
  QHash<QPersistentModelIndex,_QHashDummyValue> *in_RSI;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  QPersistentModelIndex *e;
  QSet<QPersistentModelIndex> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  const_iterator *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QPersistentModelIndex,_QHashDummyValue>::isSharedWith
                    ((QHash<QPersistentModelIndex,_QHashDummyValue> *)in_RDI,in_RSI);
  if (bVar2) {
    clear((QSet<QPersistentModelIndex> *)0x90b9b4);
  }
  else {
    begin((QSet<QPersistentModelIndex> *)in_RSI);
    end((QSet<QPersistentModelIndex> *)in_RSI);
    while (bVar2 = const_iterator::operator!=(in_RDI,in_stack_ffffffffffffffa8), bVar2) {
      __filename = const_iterator::operator*((const_iterator *)0x90ba4e);
      remove((QSet<QPersistentModelIndex> *)in_RDI,(char *)__filename);
      const_iterator::operator++(in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QSet<QPersistentModelIndex> *)in_RDI;
}

Assistant:

Q_INLINE_TEMPLATE QSet<T> &QSet<T>::subtract(const QSet<T> &other)
{
    if (q_hash.isSharedWith(other.q_hash)) {
        clear();
    } else {
        for (const auto &e : other)
            remove(e);
    }
    return *this;
}